

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::GLMClassifier::ByteSizeLong(GLMClassifier *this)

{
  uint uVar1;
  int iVar2;
  GLMClassifier_PostEvaluationTransform GVar3;
  GLMClassifier_ClassEncoding GVar4;
  ClassLabelsCase CVar5;
  GLMClassifier_DoubleArray *value;
  size_t sVar6;
  size_t sVar7;
  int cached_size;
  int cached_size_1;
  size_t data_size;
  uint local_20;
  uint count_1;
  uint i;
  uint count;
  size_t total_size;
  GLMClassifier *this_local;
  
  uVar1 = weights_size(this);
  _i = (size_t)uVar1;
  for (local_20 = 0; local_20 < uVar1; local_20 = local_20 + 1) {
    value = weights(this,local_20);
    sVar6 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::GLMClassifier_DoubleArray>(value);
    _i = sVar6 + _i;
  }
  uVar1 = offset_size(this);
  sVar6 = (ulong)uVar1 * 8;
  if ((ulong)uVar1 != 0) {
    sVar7 = google::protobuf::internal::WireFormatLite::Int32Size((int32)sVar6);
    _i = sVar7 + 1 + _i;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sVar6);
  this->_offset_cached_byte_size_ = iVar2;
  _i = sVar6 + _i;
  GVar3 = postevaluationtransform(this);
  if (GVar3 != GLMClassifier_PostEvaluationTransform_Logit) {
    GVar3 = postevaluationtransform(this);
    sVar6 = google::protobuf::internal::WireFormatLite::EnumSize(GVar3);
    _i = sVar6 + 1 + _i;
  }
  GVar4 = classencoding(this);
  if (GVar4 != GLMClassifier_ClassEncoding_ReferenceClass) {
    GVar4 = classencoding(this);
    sVar6 = google::protobuf::internal::WireFormatLite::EnumSize(GVar4);
    _i = sVar6 + 1 + _i;
  }
  CVar5 = ClassLabels_case(this);
  if (CVar5 != CLASSLABELS_NOT_SET) {
    if (CVar5 == kStringClassLabels) {
      sVar6 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::StringVector>
                        ((this->ClassLabels_).stringclasslabels_);
      _i = sVar6 + 2 + _i;
    }
    else if (CVar5 == kInt64ClassLabels) {
      sVar6 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::Int64Vector>
                        ((this->ClassLabels_).int64classlabels_);
      _i = sVar6 + 2 + _i;
    }
  }
  iVar2 = google::protobuf::internal::ToCachedSize(_i);
  this->_cached_size_ = iVar2;
  return _i;
}

Assistant:

size_t GLMClassifier::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.GLMClassifier)
  size_t total_size = 0;

  // repeated .CoreML.Specification.GLMClassifier.DoubleArray weights = 1;
  {
    unsigned int count = this->weights_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->weights(i));
    }
  }

  // repeated double offset = 2;
  {
    unsigned int count = this->offset_size();
    size_t data_size = 8UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _offset_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // .CoreML.Specification.GLMClassifier.PostEvaluationTransform postEvaluationTransform = 3;
  if (this->postevaluationtransform() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->postevaluationtransform());
  }

  // .CoreML.Specification.GLMClassifier.ClassEncoding classEncoding = 4;
  if (this->classencoding() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->classencoding());
  }

  switch (ClassLabels_case()) {
    // .CoreML.Specification.StringVector stringClassLabels = 100;
    case kStringClassLabels: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ClassLabels_.stringclasslabels_);
      break;
    }
    // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
    case kInt64ClassLabels: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ClassLabels_.int64classlabels_);
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}